

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtouchhandler.cpp
# Opt level: O2

int __thiscall
QEvdevTouchScreenData::findClosestContact
          (QEvdevTouchScreenData *this,QHash<int,_QEvdevTouchScreenData::Contact> *contacts,int x,
          int y,int *dist)

{
  byte bVar1;
  Span *pSVar2;
  Entry *pEVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long in_FS_OFFSET;
  piter local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = (piter)QHash<int,_QEvdevTouchScreenData::Contact>::constBegin(contacts);
  iVar8 = -1;
  iVar7 = -1;
  while( true ) {
    if (local_48.d == (Data<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_> *)0x0 &&
        local_48.bucket == 0) break;
    pSVar2 = (local_48.d)->spans;
    uVar4 = local_48.bucket >> 7;
    pEVar3 = pSVar2[uVar4].entries;
    bVar1 = pSVar2[uVar4].offsets[(uint)local_48.bucket & 0x7f];
    iVar6 = x - *(int *)(pEVar3[bVar1].storage.data + 8);
    iVar5 = y - *(int *)(pEVar3[bVar1].storage.data + 0xc);
    iVar5 = iVar5 * iVar5 + iVar6 * iVar6;
    if (iVar5 < iVar7 || iVar7 == -1) {
      iVar8 = *(int *)(pEVar3[bVar1].storage.data + 4);
      iVar7 = iVar5;
    }
    QHashPrivate::iterator<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_>::operator++
              (&local_48);
  }
  if (dist != (int *)0x0) {
    *dist = iVar7;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar8;
  }
  __stack_chk_fail();
}

Assistant:

int QEvdevTouchScreenData::findClosestContact(const QHash<int, Contact> &contacts, int x, int y, int *dist)
{
    int minDist = -1, id = -1;
    for (QHash<int, Contact>::const_iterator it = contacts.constBegin(), ite = contacts.constEnd();
         it != ite; ++it) {
        const Contact &contact(it.value());
        int dx = x - contact.x;
        int dy = y - contact.y;
        int dist = dx * dx + dy * dy;
        if (minDist == -1 || dist < minDist) {
            minDist = dist;
            id = contact.trackingId;
        }
    }
    if (dist)
        *dist = minDist;
    return id;
}